

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

ArrayFeatureType_ShapeRange * __thiscall
CoreML::Specification::ArrayFeatureType::_internal_mutable_shaperange(ArrayFeatureType *this)

{
  ulong uVar1;
  ArrayFeatureType_EnumeratedShapes *pAVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x1f) {
    pAVar2 = (this->ShapeFlexibility_).enumeratedshapes_;
  }
  else {
    clear_ShapeFlexibility(this);
    this->_oneof_case_[0] = 0x1f;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pAVar2 = (ArrayFeatureType_EnumeratedShapes *)
             google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::ArrayFeatureType_ShapeRange>(arena);
    (this->ShapeFlexibility_).shaperange_ = (ArrayFeatureType_ShapeRange *)pAVar2;
  }
  return (ArrayFeatureType_ShapeRange *)pAVar2;
}

Assistant:

inline ::CoreML::Specification::ArrayFeatureType_ShapeRange* ArrayFeatureType::_internal_mutable_shaperange() {
  if (!_internal_has_shaperange()) {
    clear_ShapeFlexibility();
    set_has_shaperange();
    ShapeFlexibility_.shaperange_ = CreateMaybeMessage< ::CoreML::Specification::ArrayFeatureType_ShapeRange >(GetArenaForAllocation());
  }
  return ShapeFlexibility_.shaperange_;
}